

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_kv_cursor_key(unqlite_kv_cursor *pCursor,void *pBuf,int *pnByte)

{
  int iVar1;
  SyBlob sBlob;
  
  if (pBuf != (void *)0x0) {
    sBlob.mByte = *pnByte;
    if ((int)sBlob.mByte < 0) {
      iVar1 = -0x18;
    }
    else {
      sBlob.nByte = 0;
      sBlob.pAllocator = (SyMemBackend *)0x0;
      sBlob.nFlags = 3;
      sBlob.pBlob = pBuf;
      iVar1 = (*pCursor->pStore->pIo->pMethods->xKey)(pCursor,unqliteDataConsumer,&sBlob);
      *pnByte = sBlob.nByte;
      SyBlobRelease(&sBlob);
    }
    return iVar1;
  }
  iVar1 = (*pCursor->pStore->pIo->pMethods->xKeyLength)(pCursor,pnByte);
  return iVar1;
}

Assistant:

int unqlite_kv_cursor_key(unqlite_kv_cursor *pCursor,void *pBuf,int *pnByte)
{
	int rc;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	if( pBuf == 0 ){
		/* Key length only */
		rc = pCursor->pStore->pIo->pMethods->xKeyLength(pCursor,pnByte);
	}else{
		SyBlob sBlob;
		if( (*pnByte) < 0 ){
			return UNQLITE_CORRUPT;
		}
		/* Initialize the data consumer */
		SyBlobInitFromBuf(&sBlob,pBuf,(sxu32)(*pnByte));
		/* Consume the key */
		rc = pCursor->pStore->pIo->pMethods->xKey(pCursor,unqliteDataConsumer,&sBlob);
		 /* Key length */
		*pnByte = SyBlobLength(&sBlob);
		/* Cleanup */
		SyBlobRelease(&sBlob);
	}
	return rc;
}